

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_header_encoder.c
# Opt level: O1

lzma_ret lzma_block_header_size(lzma_block *block)

{
  lzma_vli vli;
  uint32_t uVar1;
  lzma_ret lVar2;
  undefined8 in_RAX;
  int iVar3;
  lzma_ret lVar4;
  lzma_filter *filter;
  long lVar5;
  int iVar6;
  bool bVar7;
  uint32_t add;
  undefined8 uStack_38;
  
  lVar2 = LZMA_OPTIONS_ERROR;
  if (block->version < 2) {
    vli = block->compressed_size;
    uStack_38 = in_RAX;
    if (vli == 0xffffffffffffffff) {
      iVar6 = 6;
    }
    else {
      uVar1 = lzma_vli_size(vli);
      iVar6 = 6;
      if (vli != 0) {
        iVar6 = uVar1 + 6;
      }
      if (vli == 0 || uVar1 == 0) {
        return LZMA_PROG_ERROR;
      }
    }
    if (block->uncompressed_size != 0xffffffffffffffff) {
      uVar1 = lzma_vli_size(block->uncompressed_size);
      if (uVar1 == 0) {
        return LZMA_PROG_ERROR;
      }
      iVar6 = iVar6 + uVar1;
    }
    lVar4 = LZMA_PROG_ERROR;
    lVar2 = lVar4;
    if ((block->filters != (lzma_filter *)0x0) && (block->filters->id != 0xffffffffffffffff)) {
      filter = block->filters;
      bVar7 = filter->id == 0xffffffffffffffff;
      if (!bVar7) {
        lVar5 = 0x10;
        do {
          lVar2 = lzma_filter_flags_size((uint32_t *)((long)&uStack_38 + 4),filter);
          iVar3 = 0;
          if (lVar2 == LZMA_OK) {
            iVar3 = uStack_38._4_4_;
          }
          iVar6 = iVar6 + iVar3;
          if (lVar2 != LZMA_OK) goto LAB_007e2f6e;
          bVar7 = *(long *)((long)&block->filters->id + lVar5) == -1;
          lVar2 = lVar4;
          if (bVar7) goto LAB_007e2f6e;
          filter = (lzma_filter *)((long)&block->filters->id + lVar5);
          lVar5 = lVar5 + 0x10;
        } while (lVar5 != 0x50);
        lVar2 = LZMA_PROG_ERROR;
      }
LAB_007e2f6e:
      if (bVar7) {
        block->header_size = iVar6 + 3U & 0xfffffffc;
        lVar2 = LZMA_OK;
      }
    }
  }
  return lVar2;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_block_header_size(lzma_block *block)
{
	if (block->version > 1)
		return LZMA_OPTIONS_ERROR;

	// Block Header Size + Block Flags + CRC32.
	uint32_t size = 1 + 1 + 4;

	// Compressed Size
	if (block->compressed_size != LZMA_VLI_UNKNOWN) {
		const uint32_t add = lzma_vli_size(block->compressed_size);
		if (add == 0 || block->compressed_size == 0)
			return LZMA_PROG_ERROR;

		size += add;
	}

	// Uncompressed Size
	if (block->uncompressed_size != LZMA_VLI_UNKNOWN) {
		const uint32_t add = lzma_vli_size(block->uncompressed_size);
		if (add == 0)
			return LZMA_PROG_ERROR;

		size += add;
	}

	// List of Filter Flags
	if (block->filters == NULL || block->filters[0].id == LZMA_VLI_UNKNOWN)
		return LZMA_PROG_ERROR;

	for (size_t i = 0; block->filters[i].id != LZMA_VLI_UNKNOWN; ++i) {
		// Don't allow too many filters.
		if (i == LZMA_FILTERS_MAX)
			return LZMA_PROG_ERROR;

		uint32_t add;
		return_if_error(lzma_filter_flags_size(&add,
				block->filters + i));

		size += add;
	}

	// Pad to a multiple of four bytes.
	block->header_size = (size + 3) & ~UINT32_C(3);

	// NOTE: We don't verify that the encoded size of the Block stays
	// within limits. This is because it is possible that we are called
	// with exaggerated Compressed Size (e.g. LZMA_VLI_MAX) to reserve
	// space for Block Header, and later called again with lower,
	// real values.

	return LZMA_OK;
}